

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O3

bool __thiscall
BamTools::PileupEngine::PileupEnginePrivate::AddAlignment
          (PileupEnginePrivate *this,BamAlignment *al)

{
  int iVar1;
  pointer pBVar2;
  pointer pBVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  pointer this_00;
  bool bVar7;
  bool bVar8;
  
  iVar1 = al->RefID;
  if (this->IsFirstAlignment == true) {
    this->CurrentId = iVar1;
    this->CurrentPosition = al->Position;
    pBVar2 = (this->CurrentAlignments).
             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar3 = (this->CurrentAlignments).
             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pBVar2;
    if (pBVar3 != pBVar2) {
      do {
        BamAlignment::~BamAlignment(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pBVar3);
      (this->CurrentAlignments).
      super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar2;
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
    this->IsFirstAlignment = false;
  }
  else if (iVar1 == this->CurrentId) {
    iVar1 = al->Position;
    iVar6 = this->CurrentPosition;
    bVar8 = SBORROW4(iVar1,iVar6);
    iVar4 = iVar1 - iVar6;
    bVar7 = iVar1 == iVar6;
    if (!bVar7) {
      if (iVar1 < iVar6) goto LAB_001abdf6;
      while (!bVar7 && bVar8 == iVar4 < 0) {
        ApplyVisitors(this);
        iVar6 = this->CurrentPosition + 1;
        this->CurrentPosition = iVar6;
        iVar1 = al->Position;
        bVar8 = SBORROW4(iVar1,iVar6);
        iVar4 = iVar1 - iVar6;
        bVar7 = iVar1 == iVar6;
      }
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
  }
  else {
    if (iVar1 < this->CurrentId) {
LAB_001abdf6:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Pileup::Run() : Data not sorted correctly!",0x2a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      return false;
    }
    while ((this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      ApplyVisitors(this);
      this->CurrentPosition = this->CurrentPosition + 1;
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
    iVar5 = al->Position;
    this->CurrentId = al->RefID;
    this->CurrentPosition = iVar5;
  }
  return true;
}

Assistant:

bool PileupEngine::PileupEnginePrivate::AddAlignment(const BamAlignment& al)
{

    // if first time
    if (IsFirstAlignment) {

        // set initial markers
        CurrentId = al.RefID;
        CurrentPosition = al.Position;

        // store first entry
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);

        // set flag & return
        IsFirstAlignment = false;
        return true;
    }

    // if same reference
    if (al.RefID == CurrentId) {

        // if same position, store and move on
        if (al.Position == CurrentPosition) CurrentAlignments.push_back(al);

        // if less than CurrentPosition - sorting error => ABORT
        else if (al.Position < CurrentPosition) {
            std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
            return false;
        }

        // else print pileup data until 'catching up' to CurrentPosition
        else {
            while (al.Position > CurrentPosition) {
                ApplyVisitors();
                ++CurrentPosition;
            }
            CurrentAlignments.push_back(al);
        }
    }

    // if reference ID less than CurrentId - sorting error => ABORT
    else if (al.RefID < CurrentId) {
        std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
        return false;
    }

    // else moved forward onto next reference
    else {

        // print any remaining pileup data from previous reference
        while (!CurrentAlignments.empty()) {
            ApplyVisitors();
            ++CurrentPosition;
        }

        // store first entry on this new reference, update markers
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);
        CurrentId = al.RefID;
        CurrentPosition = al.Position;
    }

    return true;
}